

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc.cpp
# Opt level: O1

void __thiscall ltc::ltc(ltc *this)

{
  (this->super_brdf)._vptr_brdf = (_func_int **)&PTR__brdf_001f49f8;
  this->_amplitude = 1.0;
  this->_ltc_matrix_inv_determinant = 1.0;
  *(undefined8 *)&(this->_base_frame).value[0].field_0 = 0x3f800000;
  *(undefined8 *)((long)&(this->_base_frame).value[0].field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->_base_frame).value[1].field_0 + 4) = 0x3f800000;
  *(undefined8 *)&(this->_base_frame).value[2].field_0 = 0;
  (this->_base_frame).value[2].field_0.field_0.z = 1.0;
  *(undefined8 *)&(this->_ltc_matrix).value[0].field_0 = 0x3f800000;
  *(undefined8 *)((long)&(this->_ltc_matrix).value[0].field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->_ltc_matrix).value[1].field_0 + 4) = 0x3f800000;
  *(undefined8 *)&(this->_ltc_matrix).value[2].field_0 = 0;
  (this->_ltc_matrix).value[2].field_0.field_0.z = 1.0;
  *(undefined8 *)&(this->_ltc_matrix_inv).value[0].field_0 = 0x3f800000;
  *(undefined8 *)((long)&(this->_ltc_matrix_inv).value[0].field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->_ltc_matrix_inv).value[1].field_0 + 4) = 0x3f800000;
  *(undefined8 *)&(this->_ltc_matrix_inv).value[2].field_0 = 0;
  (this->_ltc_matrix_inv).value[2].field_0.field_0.z = 1.0;
  return;
}

Assistant:

ltc::ltc():
  _amplitude{1.0f},
  _ltc_matrix{},
  _ltc_matrix_inv{},
  _ltc_matrix_inv_determinant{1.0f}
{
}